

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O3

int __thiscall
helics::zeromq::ZmqCommsSS::processRxMessage
          (ZmqCommsSS *this,socket_t *socket,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *connection_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  error_t *peVar3;
  size_t in_RCX;
  int in_R8D;
  message_t msg2;
  message_t msg1;
  ActionMessage rep;
  string local_170;
  message_t local_150;
  undefined1 local_110 [64];
  ActionMessage local_d0;
  
  zmq_msg_init(local_110);
  zmq_msg_init(&local_150);
  zmq::detail::socket_base::recv
            (&socket->super_socket_base,(int)local_110,(void *)0x0,in_RCX,in_R8D);
  zmq::detail::socket_base::recv
            (&socket->super_socket_base,(int)&local_150,(void *)0x0,in_RCX,in_R8D);
  iVar2 = processIncomingMessage(this,&local_150,connection_info);
  if (iVar2 == 3) {
    ActionMessage::ActionMessage(&local_d0,cmd_protocol);
    local_d0.messageID = 0x130;
    zmq::detail::socket_base::send
              (&socket->super_socket_base,(int)local_110,(void *)0x2,in_RCX,in_R8D);
    paVar1 = &local_170.field_2;
    local_170._M_string_length = 0;
    local_170.field_2._M_local_buf[0] = '\0';
    local_170._M_dataplus._M_p = (pointer)paVar1;
    iVar2 = zmq_send((socket->super_socket_base)._handle,paVar1,0,2);
    if (iVar2 < 0) {
      iVar2 = zmq_errno();
      if (iVar2 != 0xb) {
        peVar3 = (error_t *)__cxa_allocate_exception(0x10);
        zmq::error_t::error_t(peVar3);
        __cxa_throw(peVar3,&zmq::error_t::typeinfo,std::exception::~exception);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,
                      CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                               local_170.field_2._M_local_buf[0]) + 1);
    }
    ActionMessage::to_string_abi_cxx11_(&local_170,&local_d0);
    iVar2 = zmq_send((socket->super_socket_base)._handle,local_170._M_dataplus._M_p,
                     local_170._M_string_length,1);
    if (iVar2 < 0) {
      iVar2 = zmq_errno();
      if (iVar2 != 0xb) {
        peVar3 = (error_t *)__cxa_allocate_exception(0x10);
        zmq::error_t::error_t(peVar3);
        __cxa_throw(peVar3,&zmq::error_t::typeinfo,std::exception::~exception);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,
                      CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                               local_170.field_2._M_local_buf[0]) + 1);
    }
    ActionMessage::~ActionMessage(&local_d0);
    iVar2 = 0;
  }
  zmq_msg_close(&local_150);
  zmq_msg_close(local_110);
  return iVar2;
}

Assistant:

int ZmqCommsSS::processRxMessage(zmq::socket_t& socket,
                                 std::map<std::string, std::string>& connection_info)
{
    int status = 0;
    zmq::message_t msg1;
    zmq::message_t msg2;

    socket.recv(msg1);
    socket.recv(msg2);
    status = processIncomingMessage(msg2, connection_info);

    if (status == 3) {
        ActionMessage rep(CMD_PROTOCOL);
        rep.messageID = CONNECTION_ACK;
        socket.send(msg1, zmq::send_flags::sndmore);
        socket.send(std::string{}, zmq::send_flags::sndmore);
        socket.send(rep.to_string(), zmq::send_flags::dontwait);
        status = 0;
    }
    return status;
}